

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeroGenerator.cpp
# Opt level: O0

char HeroGenerator::getCharForHero(Class heroClass)

{
  code *pcVar1;
  char local_9;
  Class heroClass_local;
  
  switch(heroClass) {
  case PEASANT:
    local_9 = 'P';
    break;
  case APPRENTICE:
    local_9 = 'A';
    break;
  case ARCHER:
    local_9 = 'R';
    break;
  case SWORDSMAN:
    local_9 = 'S';
    break;
  case GUNNER:
    local_9 = 'G';
    break;
  case KNIGHT:
    local_9 = 'K';
    break;
  case MONK:
    local_9 = 'M';
    break;
  case INQUISITOR:
    local_9 = 'I';
    break;
  case NONE:
    local_9 = '.';
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return local_9;
}

Assistant:

char HeroGenerator::getCharForHero(Hero::Class heroClass)
{
    switch(heroClass)
    {
        case Hero::Class::NONE:
            return '.';

        case Hero::Class::PEASANT:
            return 'P';

        case Hero::Class::SWORDSMAN:
            return 'S';
        case Hero::Class::APPRENTICE:
            return 'A';
        case Hero::Class::ARCHER:
            return 'R';

        case Hero::Class::GUNNER:
            return 'G';
        case Hero::Class::KNIGHT:
            return 'K';
        case Hero::Class::MONK:
            return 'M';
        case Hero::Class::INQUISITOR:
            return 'I';
    }
}